

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

uint ON_RowReduce(uint row_count,uint col_count,double zero_pivot_tolerance,double **constA,
                 bool bInitializeB,bool bInitializeColumnPermutation,double **A,double **B,
                 uint *column_permutation,double *pivots)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  ON_Matrix *local_50;
  
  uVar5 = (ulong)col_count;
  if (pivots == (double *)0x0) {
    pdVar10 = (double *)0x10;
  }
  else {
    *pivots = -1.0;
    pivots[1] = -1.0;
    pdVar10 = pivots + 2;
    pivots[2] = 0.0;
  }
  uVar8 = 0xffffffff;
  if (B != (double **)0x0 && (1 < col_count + 1 && 1 < row_count + 1)) {
    uVar7 = (ulong)row_count;
    if (bInitializeB) {
      for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
        pdVar6 = B[uVar4];
        for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
          pdVar6[uVar11] = 0.0;
        }
        pdVar6[uVar4] = 1.0;
      }
    }
    if (bInitializeColumnPermutation && column_permutation != (uint *)0x0) {
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        column_permutation[uVar4] = (uint)uVar4;
      }
    }
    if (A == (double **)0x0) {
      if (constA == (double **)0x0) {
        return 0xffffffff;
      }
      local_50 = (ON_Matrix *)operator_new(0x48);
      ON_Matrix::ON_Matrix(local_50,row_count,col_count);
      A = local_50->m;
    }
    else {
      local_50 = (ON_Matrix *)0x0;
    }
    if (A != (double **)0x0 && constA != (double **)0x0) {
      for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
        pdVar6 = constA[uVar4];
        pdVar1 = A[uVar4];
        for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
          pdVar1[uVar11] = pdVar6[uVar11];
        }
      }
    }
    uVar4 = (ulong)col_count;
    if (row_count < col_count) {
      uVar5 = (ulong)row_count;
    }
    uVar11 = 1;
    uVar9 = 0;
    while( true ) {
      uVar14 = uVar4;
      if (uVar4 < uVar9) {
        uVar14 = uVar9;
      }
      if (uVar9 == uVar5) goto LAB_0050c6b1;
      uVar17 = uVar9 & 0xffffffff;
      if ((uint)uVar9 < row_count) {
        uVar17 = (ulong)row_count;
      }
      dVar18 = -1.0;
      uVar13 = uVar9 & 0xffffffff;
      uVar12 = uVar9 & 0xffffffff;
      for (uVar15 = uVar9; uVar15 != uVar17; uVar15 = uVar15 + 1) {
        for (uVar16 = uVar9; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          if (dVar18 < ABS(A[uVar15][uVar16])) {
            uVar13 = uVar15 & 0xffffffff;
            uVar12 = uVar16 & 0xffffffff;
            dVar18 = ABS(A[uVar15][uVar16]);
          }
        }
      }
      if (dVar18 < 0.0) {
        uVar5 = 0xffffffff;
        goto LAB_0050c6b1;
      }
      if ((pivots != (double *)0x0) && (*pivots <= 0.0 && *pivots != 0.0)) {
        pivots[1] = dVar18;
        *pivots = dVar18;
      }
      if (dVar18 <= (double)(-(ulong)(0.0 <= zero_pivot_tolerance) & (ulong)zero_pivot_tolerance))
      break;
      if ((pivots != (double *)0x0) &&
         ((pdVar6 = pivots, *pivots <= dVar18 && dVar18 != *pivots ||
          (pdVar6 = pivots + 1, dVar18 < pivots[1])))) {
        *pdVar6 = dVar18;
      }
      pdVar6 = A[uVar13];
      pdVar1 = B[uVar13];
      if (uVar9 < uVar13) {
        A[uVar13] = A[uVar9];
        A[uVar9] = pdVar6;
        B[uVar13] = B[uVar9];
        B[uVar9] = pdVar1;
        if (column_permutation != (uint *)0x0) {
          uVar8 = column_permutation[uVar13];
          column_permutation[uVar13] = column_permutation[uVar9];
          column_permutation[uVar9] = uVar8;
        }
      }
      dVar18 = pdVar6[uVar12];
      pdVar6[uVar12] = pdVar6[uVar9];
      for (uVar14 = uVar11; uVar14 < uVar7; uVar14 = uVar14 + 1) {
        pdVar2 = A[uVar14];
        dVar19 = pdVar2[uVar12] / -dVar18;
        pdVar2[uVar12] = pdVar2[uVar9];
        if ((dVar19 != 0.0) || (NAN(dVar19))) {
          pdVar3 = B[uVar14];
          for (uVar17 = 0; uVar13 = uVar11, uVar11 != uVar17; uVar17 = uVar17 + 1) {
            pdVar3[uVar17] = pdVar1[uVar17] * dVar19 + pdVar3[uVar17];
          }
          for (; uVar13 < uVar4; uVar13 = uVar13 + 1) {
            pdVar3[uVar13] = pdVar1[uVar13] * dVar19 + pdVar3[uVar13];
            pdVar2[uVar13] = pdVar6[uVar13] * dVar19 + pdVar2[uVar13];
          }
        }
      }
      uVar9 = uVar9 + 1;
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    uVar5 = uVar9;
    if (pivots != (double *)0x0) {
      *pdVar10 = dVar18;
    }
LAB_0050c6b1:
    uVar8 = (uint)uVar5;
    if (local_50 != (ON_Matrix *)0x0) {
      (*local_50->_vptr_ON_Matrix[1])();
    }
  }
  return uVar8;
}

Assistant:

unsigned int ON_RowReduce(
  unsigned int row_count,
  unsigned int col_count,
  double zero_pivot_tolerance,
  const double*const* constA,
  bool bInitializeB,
  bool bInitializeColumnPermutation,
  double** A,
  double** B,
  unsigned int* column_permutation,
  double pivots[3]
  )
{
  double pivots_buffer[3];
  if (nullptr == pivots)
    pivots = pivots_buffer;
  pivots[0] = pivots[1] = -1.0;
  pivots[2] = 0.0;

  if (row_count < 1 || ON_UNSET_UINT_INDEX == row_count)
    return ON_UNSET_UINT_INDEX;

  if (col_count < 1 || ON_UNSET_UINT_INDEX == col_count)
    return ON_UNSET_UINT_INDEX;

  if (nullptr == B)
    return ON_UNSET_UINT_INDEX;

  unsigned int i, j;
  double* a;
  double* b;

  if (bInitializeB)
  {
    for (i = 0; i < row_count; i++)
    {
      b = B[i];
      for (j = 0; j < row_count; j++)
        b[j] = 0.0;
      b[i] = 1.0;
    }
  }

  if (bInitializeColumnPermutation && nullptr != column_permutation)
  {
    for (j = 0; j < row_count; j++)
      column_permutation[j] = j;
  }

  if (!(zero_pivot_tolerance >= 0.0))
    zero_pivot_tolerance = 0.0;

  std::unique_ptr< ON_Matrix > uA;
  if (nullptr == A)
  {
    if (nullptr == constA)
      return ON_UNSET_UINT_INDEX;
    uA = std::unique_ptr< ON_Matrix >(new ON_Matrix(row_count, col_count));
    A = uA.get()->m;
  }

  if (nullptr != constA && nullptr != A)
  {
    for (i = 0; i < row_count; i++)
    {
      const double* c = constA[i];
      a = A[i];
      for (j = 0; j < row_count; j++)
        a[j] = c[j];
    }
  }

  double* r;
  double* s;
  double x, xx;
  unsigned int ii, jj;
  ii = jj = 0;
  xx = fabs(A[ii][jj]);
  unsigned int rank;
  for (rank = 0; rank < row_count; rank++)
  {
    if (rank >= col_count)
      return rank;

    xx = -1.0;
    ii = jj = rank;
    for (i = rank; i < row_count; i++)
    {
      r = A[i];
      for (j = rank; j < col_count; j++)
      {
        x = fabs(r[j]);
        if (x > xx)
        {
          ii = i;
          jj = j;
          xx = x;
        }
      }
    }

    if (!(xx >= 0.0))
      return ON_UNSET_UINT_INDEX;

    if (pivots[0] < 0.0)
      pivots[0] = pivots[1] = xx;

    if (xx <= zero_pivot_tolerance)
    {
      pivots[2] = xx;
      return rank;
    }

    if (xx > pivots[0])
      pivots[0] = xx;
    else if (xx < pivots[1])
      pivots[1] = xx;


    a = A[ii];
    b = B[ii];
    if (ii > rank)
    {
      // swap rows M[ii] and M[rank] so maximum coefficient is in M[rank][jj]
      A[ii] = A[rank];
      A[rank] = a;
      B[ii] = B[rank];
      B[rank] = b;
      if (nullptr != column_permutation)
      {
        j = column_permutation[ii];
        column_permutation[ii] = column_permutation[rank];
        column_permutation[rank] = j;
      }
    }

    // swap columns M[jj] and M[rank] to maximum coefficient is in M[rank][rank]
    xx = -a[jj];
    a[jj] = a[rank];
    //a[rank] = -xx; // DEBUG

    for (i = rank + 1; i < row_count; i++)
    {
      // swap columns M[jj] and M[rank] 
      r = A[i];
      x = r[jj] / xx;
      //double dd = r[jj]; // DEBUG
      r[jj] = r[rank];
      //r[rank] = dd; // DEBUG

      // Use row operation
      // M[i] = M[i] - (row[i]/M[rank][rank])*M[rank]
      // to M[i][rank]
      if (0.0 != x)
      {
        s = B[i];
        for (j = 0; j <= rank; j++)
        {
          s[j] += x*b[j];
          //r[j] += x*a[j]; // DEBUG
        }
        for (/*empty init*/; j < col_count; j++)
        {
          s[j] += x*b[j];
          r[j] += x*a[j];
        }
      }
    }
  }
  return rank;
}